

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_do(Curl_easy *data,_Bool *done)

{
  byte *pbVar1;
  Curl_llist *list;
  connectdata *pcVar2;
  WildcardData *pWVar3;
  FILEPROTO *pFVar4;
  curl_chunk_bgn_callback p_Var5;
  void *pvVar6;
  WildcardData *pWVar7;
  curl_trc_feat *pcVar8;
  connectdata *pcVar9;
  byte bVar10;
  _Bool connected;
  CURLcode CVar11;
  uint uVar12;
  undefined8 *puVar13;
  long lVar14;
  Curl_llist_node *pCVar15;
  size_t sVar16;
  char *pcVar17;
  ftp_wc *pfVar18;
  ftp_parselist_data *pfVar19;
  char *pcVar20;
  uchar uVar21;
  Curl_cwriter *ftp_lc_writer;
  Curl_cwriter *local_48;
  connectdata *local_40;
  _Bool *local_38;
  
  pcVar2 = data->conn;
  *done = false;
  pbVar1 = (byte *)((long)&pcVar2->proto + 0x112);
  *pbVar1 = *pbVar1 & 0xdf;
  CVar11 = Curl_cwriter_create(&local_48,data,&ftp_cw_lc,CURL_CW_CONTENT_DECODE);
  if (CVar11 != CURLE_OK) {
    return CVar11;
  }
  CVar11 = Curl_cwriter_add(data,local_48);
  if (CVar11 != CURLE_OK) {
    Curl_cwriter_free(data,local_48);
    return CVar11;
  }
  if (((data->state).field_0x774 & 0x40) != 0) {
    pWVar3 = data->wildcard;
    local_40 = data->conn;
    list = &pWVar3->filelist;
    local_38 = done;
switchD_00127780_default:
    switch(pWVar3->state) {
    case '\0':
    case '\x06':
    case '\a':
      goto switchD_00127780_caseD_0;
    case '\x01':
      pFVar4 = (data->req).p.file;
      pcVar20 = pFVar4->path;
      pWVar7 = data->wildcard;
      pcVar17 = strrchr(pcVar20,0x2f);
      if (pcVar17 == (char *)0x0) {
        if (*pcVar20 != '\0') {
          pcVar17 = (*Curl_cstrdup)(pcVar20);
          pWVar7->pattern = pcVar17;
          goto LAB_00127a74;
        }
LAB_00127afd:
        pWVar7->state = '\x04';
        CVar11 = ftp_parse_url_path(data);
      }
      else {
        if (pcVar17[1] == '\0') goto LAB_00127afd;
        pcVar20 = pcVar17 + 1;
        pcVar17 = (*Curl_cstrdup)(pcVar20);
        pWVar7->pattern = pcVar17;
LAB_00127a74:
        if (pcVar17 == (char *)0x0) {
          CVar11 = CURLE_OUT_OF_MEMORY;
        }
        else {
          *pcVar20 = '\0';
          pfVar18 = (ftp_wc *)(*Curl_ccalloc)(1,0x18);
          if (pfVar18 == (ftp_wc *)0x0) {
            CVar11 = CURLE_OUT_OF_MEMORY;
          }
          else {
            pfVar19 = Curl_ftp_parselist_data_alloc();
            pfVar18->parser = pfVar19;
            CVar11 = CURLE_OUT_OF_MEMORY;
            if (pfVar19 != (ftp_parselist_data *)0x0) {
              pWVar7->ftpwc = pfVar18;
              pWVar7->dtor = wc_data_dtor;
              if ((data->set).ftp_filemethod == '\x02') {
                (data->set).ftp_filemethod = '\x01';
              }
              CVar11 = ftp_parse_url_path(data);
              if (CVar11 == CURLE_OK) {
                pcVar20 = (*Curl_cstrdup)(pFVar4->path);
                pWVar7->path = pcVar20;
                CVar11 = CURLE_OUT_OF_MEMORY;
                if (pcVar20 != (char *)0x0) {
                  (pfVar18->backup).write_function = (data->set).fwrite_func;
                  (data->set).fwrite_func = Curl_ftp_parselist;
                  (pfVar18->backup).file_descriptor = (FILE *)(data->set).out;
                  (data->set).out = data;
                  CVar11 = CURLE_OK;
                  if ((((data->set).field_0x8cd & 0x10) != 0) &&
                     ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar8->log_level)))) {
                    CVar11 = CURLE_OK;
                    Curl_infof(data,"Wildcard - Parsing started");
                  }
                  goto LAB_00127b52;
                }
              }
            }
            Curl_ftp_parselist_data_free((ftp_parselist_data **)pfVar18);
            (*Curl_cfree)(pfVar18);
          }
          (*Curl_cfree)(pWVar7->pattern);
          pWVar7->pattern = (char *)0x0;
          pWVar7->ftpwc = (ftp_wc *)0x0;
          pWVar7->dtor = (wildcard_dtor)0x0;
        }
      }
LAB_00127b52:
      if (pWVar3->state != '\x04') {
        bVar10 = (CVar11 != CURLE_OK) << 2 | 2;
        goto LAB_00127b64;
      }
      goto LAB_00127b69;
    case '\x02':
      pfVar18 = pWVar3->ftpwc;
      (data->set).fwrite_func = (pfVar18->backup).write_function;
      (data->set).out = (pfVar18->backup).file_descriptor;
      (pfVar18->backup).write_function = (curl_write_callback)0x0;
      (pfVar18->backup).file_descriptor = (FILE *)0x0;
      pWVar3->state = '\x03';
      CVar11 = Curl_ftp_parselist_geterror(pfVar18->parser);
      uVar21 = '\x04';
      if (CVar11 == CURLE_OK) {
        sVar16 = Curl_llist_count(list);
        if (sVar16 == 0) {
          pWVar3->state = '\x04';
          CVar11 = CURLE_REMOTE_FILE_NOT_FOUND;
          goto LAB_00127b69;
        }
        goto switchD_00127780_default;
      }
      break;
    case '\x03':
      pCVar15 = Curl_llist_head(list);
      puVar13 = (undefined8 *)Curl_node_elem(pCVar15);
      pFVar4 = (data->req).p.file;
      pcVar20 = curl_maprintf("%s%s",pWVar3->path,*puVar13);
      if (pcVar20 == (char *)0x0) {
        CVar11 = CURLE_OUT_OF_MEMORY;
        goto LAB_00127b69;
      }
      (*Curl_cfree)(pFVar4->freepath);
      pFVar4->path = pcVar20;
      pFVar4->freepath = pcVar20;
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 || (0 < pcVar8->log_level))))
      {
        Curl_infof(data,"Wildcard - START of \"%s\"",*puVar13);
      }
      if ((data->set).chunk_bgn != (curl_chunk_bgn_callback)0x0) {
        Curl_set_in_callback(data,true);
        p_Var5 = (data->set).chunk_bgn;
        pvVar6 = (data->set).wildcardptr;
        sVar16 = Curl_llist_count(list);
        lVar14 = (*p_Var5)(puVar13,pvVar6,(int)sVar16);
        Curl_set_in_callback(data,false);
        if (lVar14 == 2) {
          uVar21 = '\x05';
          if ((((data->set).field_0x8cd & 0x10) != 0) &&
             ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 ||
              (0 < pcVar8->log_level)))) {
            Curl_infof(data,"Wildcard - \"%s\" skipped by user",*puVar13);
          }
          break;
        }
        if (lVar14 == 1) {
          CVar11 = CURLE_CHUNK_FAILED;
          goto LAB_00127b69;
        }
      }
      uVar21 = '\x05';
      if (*(int *)(puVar13 + 1) == 0) {
        if ((*(byte *)(puVar13 + 0xc) & 0x40) != 0) {
          (local_40->proto).ftpc.known_filesize = puVar13[5];
        }
        CVar11 = ftp_parse_url_path(data);
        if (CVar11 == CURLE_OK) {
          pCVar15 = Curl_llist_head(list);
          Curl_node_remove(pCVar15);
          sVar16 = Curl_llist_count(list);
          CVar11 = CURLE_OK;
          if (sVar16 == 0) {
            pWVar3->state = '\x04';
          }
        }
        goto LAB_00127b69;
      }
      break;
    case '\x04':
      if (pWVar3->ftpwc == (ftp_wc *)0x0) {
        bVar10 = 7;
        CVar11 = CURLE_OK;
      }
      else {
        CVar11 = Curl_ftp_parselist_geterror(pWVar3->ftpwc->parser);
        bVar10 = CVar11 == CURLE_OK | 6;
      }
LAB_00127b64:
      pWVar3->state = bVar10;
      goto LAB_00127b69;
    case '\x05':
      if ((data->set).chunk_end != (curl_chunk_end_callback)0x0) {
        Curl_set_in_callback(data,true);
        (*(data->set).chunk_end)((data->set).wildcardptr);
        Curl_set_in_callback(data,false);
      }
      pCVar15 = Curl_llist_head(list);
      Curl_node_remove(pCVar15);
      sVar16 = Curl_llist_count(list);
      uVar21 = (sVar16 == 0) + '\x03';
      break;
    default:
      goto switchD_00127780_default;
    }
    pWVar3->state = uVar21;
    goto switchD_00127780_default;
  }
  CVar11 = ftp_parse_url_path(data);
joined_r0x00127b8a:
  if (CVar11 != CURLE_OK) {
    return CVar11;
  }
  pcVar2 = data->conn;
  (data->req).size = -1;
  Curl_pgrsSetUploadCounter(data,0);
  Curl_pgrsSetDownloadCounter(data,0);
  Curl_pgrsSetUploadSize(data,-1);
  Curl_pgrsSetDownloadSize(data,-1);
  pbVar1 = (byte *)((long)&pcVar2->proto + 0x112);
  *pbVar1 = *pbVar1 | 4;
  if ((((data->set).field_0x8cd & 0x10) != 0) &&
     (((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 || (0 < pcVar8->log_level)) &&
      (0 < Curl_trc_feat_ftp.log_level)))) {
    if (data->conn == (connectdata *)0x0) {
      pcVar20 = "???";
    }
    else {
      pcVar20 = ftp_state_names[(data->conn->proto).ftpc.state];
    }
    Curl_trc_ftp(data,"[%s] DO phase starts",pcVar20);
  }
  if (((data->req).field_0xdb & 2) != 0) {
    ((data->req).p.file)->fd = 1;
  }
  *done = false;
  CVar11 = ftp_state_quote(data,true,'\f');
  if (CVar11 == CURLE_OK) {
    pcVar9 = data->conn;
    CVar11 = Curl_pp_statemach(data,&(pcVar9->proto).ftpc.pp,false,false);
    *done = (pcVar9->proto).ftpc.state == '\0';
    connected = Curl_conn_is_connected(data->conn,1);
    uVar12 = (uint)*(undefined8 *)&(data->set).field_0x8ca;
    if (connected) {
      if (((uVar12 >> 0x1c & 1) != 0) &&
         ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 || (0 < pcVar8->log_level))))
      {
        if (data->conn == (connectdata *)0x0) {
          pcVar20 = "???";
        }
        else {
          pcVar20 = ftp_state_names[(data->conn->proto).ftpc.state];
        }
        Curl_infof(data,"[FTP] [%s] perform, DATA connection established",pcVar20);
      }
    }
    else if ((((uVar12 >> 0x1c & 1) != 0) &&
             ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 ||
              (0 < pcVar8->log_level)))) && (0 < Curl_trc_feat_ftp.log_level)) {
      if (data->conn == (connectdata *)0x0) {
        pcVar20 = "???";
      }
      else {
        pcVar20 = ftp_state_names[(data->conn->proto).ftpc.state];
      }
      Curl_trc_ftp(data,"[%s] perform, awaiting DATA connect",pcVar20);
    }
    if ((((*done == true) && (((data->set).field_0x8cd & 0x10) != 0)) &&
        ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 || (0 < pcVar8->log_level))))
       && (0 < Curl_trc_feat_ftp.log_level)) {
      if (data->conn == (connectdata *)0x0) {
        pcVar20 = "???";
      }
      else {
        pcVar20 = ftp_state_names[(data->conn->proto).ftpc.state];
      }
      Curl_trc_ftp(data,"[%s] DO phase is complete1",pcVar20);
    }
    if (CVar11 == CURLE_OK) {
      if (*done != true) {
        return CURLE_OK;
      }
      CVar11 = ftp_dophase_done(data,connected);
      return CVar11;
    }
  }
  freedirs(&(pcVar2->proto).ftpc);
  return CVar11;
switchD_00127780_caseD_0:
  CVar11 = CURLE_OK;
  if (pWVar3->dtor != (wildcard_dtor)0x0) {
    (*pWVar3->dtor)(pWVar3->ftpwc);
    pWVar3->ftpwc = (ftp_wc *)0x0;
  }
LAB_00127b69:
  done = local_38;
  if ((data->wildcard->state | 2) == 7) {
    return CURLE_OK;
  }
  goto joined_r0x00127b8a;
}

Assistant:

static CURLcode ftp_do(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  *done = FALSE; /* default to false */
  ftpc->wait_data_conn = FALSE; /* default to no such wait */

#ifdef CURL_PREFER_LF_LINEENDS
  {
    /* FTP data may need conversion. */
    struct Curl_cwriter *ftp_lc_writer;

    result = Curl_cwriter_create(&ftp_lc_writer, data, &ftp_cw_lc,
                                 CURL_CW_CONTENT_DECODE);
    if(result)
      return result;

    result = Curl_cwriter_add(data, ftp_lc_writer);
    if(result) {
      Curl_cwriter_free(data, ftp_lc_writer);
      return result;
    }
  }
#endif /* CURL_PREFER_LF_LINEENDS */

  if(data->state.wildcardmatch) {
    result = wc_statemach(data);
    if(data->wildcard->state == CURLWC_SKIP ||
       data->wildcard->state == CURLWC_DONE) {
      /* do not call ftp_regular_transfer */
      return CURLE_OK;
    }
    if(result) /* error, loop or skipping the file */
      return result;
  }
  else { /* no wildcard FSM needed */
    result = ftp_parse_url_path(data);
    if(result)
      return result;
  }

  result = ftp_regular_transfer(data, done);

  return result;
}